

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractSyntaxTree.cpp
# Opt level: O2

void __thiscall MyCompiler::AbstractAstNode::AbstractAstNode(AbstractAstNode *this,string *name)

{
  int iVar1;
  
  iVar1 = counter + 1;
  this->id = counter;
  counter = iVar1;
  this->caseNum = 0;
  std::__cxx11::string::string((string *)&this->name,(string *)name);
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  (this->value)._M_string_length = 0;
  (this->value).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

MyCompiler::AbstractAstNode::AbstractAstNode(std::string name)
        : id(counter++), name(std::move(name))
{}